

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O2

void __thiscall
RTree::distribute_polygons
          (RTree *this,RTree_node *node,RTree_node *brother,
          vector<d_leaf,_std::allocator<d_leaf>_> *data)

{
  uint uVar1;
  pointer pdVar2;
  RTree *pRVar3;
  int iVar4;
  int iVar5;
  RTree *pRVar6;
  Polygon *pPVar7;
  RTree *pRVar8;
  Polygon *pPVar9;
  int iVar10;
  long lVar11;
  RTree_node *pRVar12;
  RTree *pRVar13;
  int in_R8D;
  int m;
  ulong uVar14;
  d_leaf data_00;
  
  uVar1 = node->father->elements;
  pRVar8 = (RTree *)0x0;
  pRVar6 = (RTree *)(ulong)uVar1;
  if ((int)uVar1 < 1) {
    pRVar6 = pRVar8;
  }
  lVar11 = 8;
  pRVar13 = this;
  for (; pRVar6 != pRVar8; pRVar8 = (RTree *)((long)&pRVar8->root + 1)) {
    pRVar12 = *(RTree_node **)
               ((long)&((node->father->data_internal_node).
                        super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>.
                        _M_impl.super__Vector_impl_data._M_start)->region + lVar11);
    pRVar3 = pRVar13;
    if (pRVar12 == brother) {
      pRVar3 = pRVar8;
    }
    if (pRVar12 != node) {
      pRVar13 = pRVar3;
    }
    pRVar13 = (RTree *)((ulong)pRVar13 & 0xffffffff);
    if (pRVar12 == node) {
      in_R8D = (int)pRVar8;
    }
    lVar11 = lVar11 + 0x10;
  }
  lVar11 = 8;
  uVar14 = 0;
  do {
    pdVar2 = (data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar2 >> 4) <= uVar14) {
      return;
    }
    iVar4 = Polygon::cost_two_poligons
                      ((node->father->data_internal_node).
                       super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl
                       .super__Vector_impl_data._M_start[in_R8D].region,
                       *(Polygon **)((long)&pdVar2->polygon + lVar11));
    iVar5 = Polygon::cost_two_poligons
                      ((brother->father->data_internal_node).
                       super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl
                       .super__Vector_impl_data._M_start[(int)pRVar13].region,
                       *(Polygon **)
                        ((long)&((data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl
                                 .super__Vector_impl_data._M_start)->polygon + lVar11));
    pRVar12 = node;
    if ((iVar4 < iVar5) && (node->elements <= this->M - this->m)) {
      pdVar2 = (data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pPVar9 = *(Polygon **)((long)pdVar2 + lVar11 + -8);
      pPVar7 = *(Polygon **)((long)&pdVar2->polygon + lVar11);
    }
    else {
      iVar10 = this->M - this->m;
      if ((iVar5 < iVar4) && (brother->elements <= iVar10)) {
        pdVar2 = (data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar9 = *(Polygon **)((long)pdVar2 + lVar11 + -8);
        pPVar7 = *(Polygon **)((long)&pdVar2->polygon + lVar11);
      }
      else {
        pdVar2 = (data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar9 = *(Polygon **)((long)pdVar2 + lVar11 + -8);
        pPVar7 = *(Polygon **)((long)&pdVar2->polygon + lVar11);
        if (node->elements <= iVar10) goto LAB_00104c63;
      }
      pRVar12 = brother;
    }
LAB_00104c63:
    data_00.region = pPVar7;
    data_00.polygon = pPVar9;
    insert_polygon(this,pRVar12,data_00);
    uVar14 = uVar14 + 1;
    lVar11 = lVar11 + 0x10;
  } while( true );
}

Assistant:

void RTree::distribute_polygons(RTree_node * node, RTree_node * brother, const std::vector<d_leaf> & data){
    int i, j ;
    //Search where is the node & brother in the father.
    for(int a = 0; a < node->father->elements; a++){
        if(node->father->data_internal_node[a].child == node){
            i = a;
        }
        else if(node->father->data_internal_node[a].child == brother){
            j = a;
        }
    }
    for(int m = 0; m < data.size(); m++){
        int cost_node = node->father->data_internal_node[i].region->cost_two_poligons(*data[m].region);
        int cost_brother = brother->father->data_internal_node[j].region->cost_two_poligons(*data[m].region);
        if(cost_node < cost_brother && node->elements < this->M - this->m + 1){
            insert_polygon(node, data[m]);
        }
        else if(cost_node > cost_brother && brother->elements < this->M - this->m + 1){
            insert_polygon(brother, data[m]);
        }
        else{
            if(node->elements < this->M - this->m + 1){
                insert_polygon(node, data[m]);
            }
            else{
                insert_polygon(brother, data[m]);
            }
        }
    }
}